

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O0

void nhr_response_parse_status_code(nhr_response r,char *received)

{
  int iVar1;
  char *pcVar2;
  char *value;
  char *pcStack_18;
  int code;
  char *received_local;
  nhr_response r_local;
  
  value._4_4_ = 0;
  pcStack_18 = received;
  received_local = (char *)r;
  pcVar2 = strstr(received," ");
  if (((pcVar2 != (char *)0x0) &&
      (iVar1 = __isoc99_sscanf(pcVar2," %i",(long)&value + 4), iVar1 == 1)) && (0 < value._4_4_)) {
    *(short *)(received_local + 0x20) = (short)value._4_4_;
  }
  return;
}

Assistant:

void nhr_response_parse_status_code(nhr_response r, char * received) {
	int code = 0;
	char * value = strstr(received, " ");
	if (!value) {
		return;
	}

	if (nhr_sscanf(value, " %i", &code) == 1 && code > 0) {
		r->status_code = code;
	}
}